

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::TParseContext::addConstructor
          (TParseContext *this,TSourceLoc *loc,TIntermNode *node,TType *type)

{
  TIntermNode *node_00;
  char cVar1;
  int iVar2;
  TOperator op;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermNode *node_01;
  undefined4 extraout_var_02;
  long *plVar5;
  long lVar6;
  undefined4 extraout_var_03;
  TIntermTyped *pTVar7;
  TSourceLoc *pTVar8;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  long lVar9;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  TType *pTVar10;
  undefined8 *puVar11;
  byte bVar12;
  bool bVar13;
  byte bVar14;
  byte bVar15;
  bool bVar16;
  TType elementType;
  char *specConstantCompositeExt [1];
  undefined8 *local_198;
  TType local_160;
  TType local_c8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_04;
  
  if (node == (TIntermNode *)0x0) {
    return (TIntermTyped *)0x0;
  }
  iVar2 = (*node->_vptr_TIntermNode[3])(node);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    return (TIntermTyped *)0x0;
  }
  iVar2 = (*node->_vptr_TIntermNode[3])(node);
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x43])
            (this,loc,"constructor",CONCAT44(extraout_var_00,iVar2));
  iVar2 = (*node->_vptr_TIntermNode[6])(node);
  node_01 = (TIntermNode *)CONCAT44(extraout_var_01,iVar2);
  op = TIntermediate::mapTypeToConstructorOp
                 ((this->super_TParseContextBase).super_TParseVersions.intermediate,type);
  if (node_01 != (TIntermNode *)0x0 && op == EOpConstructTextureSampler) {
    iVar2 = (*node_01->_vptr_TIntermNode[0x32])(node_01);
    plVar5 = (long *)(**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_02,iVar2) + 8) + 8) +
                                 0x18))();
    plVar5 = (long *)(**(code **)(*plVar5 + 0xf0))(plVar5);
    lVar6 = (**(code **)(*plVar5 + 0x40))(plVar5);
    if ((*(byte *)(lVar6 + 2) & 2) != 0) {
      iVar2 = (*node_01->_vptr_TIntermNode[0x32])(node_01);
      plVar5 = (long *)(**(code **)(*(long *)**(undefined8 **)(CONCAT44(extraout_var_03,iVar2) + 8)
                                   + 0x18))();
      plVar5 = (long *)(**(code **)(*plVar5 + 0xf8))(plVar5);
      lVar6 = (**(code **)(*plVar5 + 0x48))(plVar5);
      *(byte *)(lVar6 + 2) = *(byte *)(lVar6 + 2) | 2;
    }
    pTVar7 = TIntermediate::setAggregateOperator
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,node_01,
                        EOpConstructTextureSampler,type,loc);
    return pTVar7;
  }
  if (op == EOpConstructStruct) {
    iVar2 = (*type->_vptr_TType[0x25])(type);
    if ((char)iVar2 == '\0') {
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
    local_198 = *(undefined8 **)&((type->field_13).referentType)->field_0x8;
  }
  else {
    local_198 = (undefined8 *)0x0;
  }
  TType::TType(&local_160,EbtVoid,EvqTemporary,1,0,0,false);
  iVar2 = (*type->_vptr_TType[0x1d])(type);
  pTVar10 = type;
  if ((char)iVar2 != '\0') {
    TType::TType(&local_c8,type,0,false);
    pTVar10 = &local_c8;
  }
  TType::shallowCopy(&local_160,pTVar10);
  if ((node_01 != (TIntermNode *)0x0) && (node_01[5].loc.column == 0)) {
    iVar2 = (*node_01->_vptr_TIntermNode[0x32])(node_01);
    lVar6 = CONCAT44(extraout_var_06,iVar2);
    puVar11 = *(undefined8 **)(lVar6 + 8);
    bVar16 = false;
    if (puVar11 == *(undefined8 **)(lVar6 + 0x10)) {
      bVar13 = true;
    }
    else {
      iVar2 = 1;
      bVar12 = 0;
      bVar14 = 1;
      do {
        iVar4 = (*type->_vptr_TType[0x1d])();
        node_00 = (TIntermNode *)*puVar11;
        if ((char)iVar4 == '\0') {
          if (op == EOpConstructStruct) {
            pTVar10 = (TType *)*local_198;
            iVar4 = (**node->_vptr_TIntermNode)(node);
            pTVar8 = (TSourceLoc *)CONCAT44(extraout_var_08,iVar4);
            goto LAB_0041f50d;
          }
          iVar4 = (*node_00->_vptr_TIntermNode[3])(node_00);
          iVar3 = (**node->_vptr_TIntermNode)(node);
          pTVar7 = constructBuiltIn(this,type,op,(TIntermTyped *)CONCAT44(extraout_var_09,iVar4),
                                    (TSourceLoc *)CONCAT44(extraout_var_10,iVar3),true);
        }
        else {
          iVar4 = (**node->_vptr_TIntermNode)(node);
          pTVar8 = (TSourceLoc *)CONCAT44(extraout_var_07,iVar4);
          pTVar10 = &local_160;
LAB_0041f50d:
          pTVar7 = constructAggregate(this,node_00,pTVar10,iVar2,pTVar8);
        }
        if (pTVar7 == (TIntermTyped *)0x0) {
          return (TIntermTyped *)0x0;
        }
        *puVar11 = pTVar7;
        iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar7);
        lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar4) + 0x58))
                          ((long *)CONCAT44(extraout_var_11,iVar4));
        bVar15 = 0;
        if ((*(ulong *)(lVar9 + 8) & 0x100000000) != 0) {
          bVar15 = bVar14;
        }
        if ((*(ulong *)(lVar9 + 8) & 0x10000007f) == 2) {
          bVar15 = bVar14;
        }
        iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar7);
        lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar4) + 0x58))
                          ((long *)CONCAT44(extraout_var_12,iVar4));
        if ((*(ulong *)(lVar9 + 8) & 0x100000000) != 0) {
          bVar12 = 1;
        }
        puVar11 = puVar11 + 1;
        iVar2 = iVar2 + 1;
        local_198 = local_198 + 4;
        bVar14 = bVar15;
      } while (puVar11 != *(undefined8 **)(lVar6 + 0x10));
      bVar16 = (bool)(bVar15 ^ 1);
      bVar13 = (bool)(bVar12 ^ 1);
    }
    pTVar7 = TIntermediate::setAggregateOperator
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,node_01,op
                        ,type,loc);
    local_c8._vptr_TType = (_func_int **)0x701d65;
    iVar2 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0xc])
                      (this,loc,1,&local_c8,"spec constant aggregate constructor");
    if ((((char)iVar2 != '\0') && (!bVar16)) && (!bVar13)) {
      iVar2 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1f])(pTVar7);
      lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar2) + 0x50))
                        ((long *)CONCAT44(extraout_var_15,iVar2));
      *(ulong *)(lVar6 + 8) = (*(ulong *)(lVar6 + 8) & 0xfffffffeffffff80) + 0x100000002;
    }
    iVar2 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[6])(pTVar7);
    plVar5 = (long *)CONCAT44(extraout_var_16,iVar2);
    if (plVar5 != (long *)0x0) {
      cVar1 = (**(code **)(*plVar5 + 0x158))(plVar5);
      if (((cVar1 == '\0') && (cVar1 = (**(code **)(*plVar5 + 0x150))(plVar5), cVar1 == '\0')) &&
         (cVar1 = (**(code **)(*plVar5 + 0x148))(plVar5), cVar1 == '\0')) {
        return pTVar7;
      }
      (**(code **)(*plVar5 + 0x180))(plVar5);
      return pTVar7;
    }
    return pTVar7;
  }
  iVar2 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar2 == '\0') {
    if (op != EOpConstructStruct) {
      iVar2 = (*node->_vptr_TIntermNode[3])(node);
      iVar4 = (**node->_vptr_TIntermNode)(node);
      pTVar7 = constructBuiltIn(this,type,op,(TIntermTyped *)CONCAT44(extraout_var_13,iVar2),
                                (TSourceLoc *)CONCAT44(extraout_var_14,iVar4),false);
      goto LAB_0041f62e;
    }
    pTVar10 = (TType *)*local_198;
    iVar2 = (**node->_vptr_TIntermNode)(node);
    pTVar8 = (TSourceLoc *)CONCAT44(extraout_var_05,iVar2);
  }
  else {
    iVar2 = (**node->_vptr_TIntermNode)(node);
    pTVar8 = (TSourceLoc *)CONCAT44(extraout_var_04,iVar2);
    pTVar10 = &local_160;
  }
  pTVar7 = constructAggregate(this,node,pTVar10,1,pTVar8);
LAB_0041f62e:
  if (pTVar7 == (TIntermTyped *)0x0) {
    return (TIntermTyped *)0x0;
  }
  iVar2 = (*type->_vptr_TType[0x1d])(type);
  if ((op != EOpConstructStruct) && ((char)iVar2 == '\0')) {
    return pTVar7;
  }
  pTVar7 = TIntermediate::setAggregateOperator
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                      &pTVar7->super_TIntermNode,EOpConstructStruct,type,loc);
  return pTVar7;
}

Assistant:

TIntermTyped* TParseContext::addConstructor(const TSourceLoc& loc, TIntermNode* node, const TType& type)
{
    if (node == nullptr || node->getAsTyped() == nullptr)
        return nullptr;
    rValueErrorCheck(loc, "constructor", node->getAsTyped());

    TIntermAggregate* aggrNode = node->getAsAggregate();
    TOperator op = intermediate.mapTypeToConstructorOp(type);

    // Combined texture-sampler constructors are completely semantic checked
    // in constructorTextureSamplerError()
    if (op == EOpConstructTextureSampler) {
        if (aggrNode != nullptr) {
            if (aggrNode->getSequence()[1]->getAsTyped()->getType().getSampler().shadow) {
                // Transfer depth into the texture (SPIR-V image) type, as a hint
                // for tools to know this texture/image is a depth image.
                aggrNode->getSequence()[0]->getAsTyped()->getWritableType().getSampler().shadow = true;
            }
            return intermediate.setAggregateOperator(aggrNode, op, type, loc);
        }
    }

    TTypeList::const_iterator memberTypes;
    if (op == EOpConstructStruct)
        memberTypes = type.getStruct()->begin();

    TType elementType;
    if (type.isArray()) {
        TType dereferenced(type, 0);
        elementType.shallowCopy(dereferenced);
    } else
        elementType.shallowCopy(type);

    bool singleArg;
    if (aggrNode) {
        if (aggrNode->getOp() != EOpNull)
            singleArg = true;
        else
            singleArg = false;
    } else
        singleArg = true;

    TIntermTyped *newNode;
    if (singleArg) {
        // If structure constructor or array constructor is being called
        // for only one parameter inside the structure, we need to call constructAggregate function once.
        if (type.isArray())
            newNode = constructAggregate(node, elementType, 1, node->getLoc());
        else if (op == EOpConstructStruct)
            newNode = constructAggregate(node, *(*memberTypes).type, 1, node->getLoc());
        else
            newNode = constructBuiltIn(type, op, node->getAsTyped(), node->getLoc(), false);

        if (newNode && (type.isArray() || op == EOpConstructStruct))
            newNode = intermediate.setAggregateOperator(newNode, EOpConstructStruct, type, loc);

        return newNode;
    }

    //
    // Handle list of arguments.
    //
    TIntermSequence &sequenceVector = aggrNode->getSequence();    // Stores the information about the parameter to the constructor
    // if the structure constructor contains more than one parameter, then construct
    // each parameter

    int paramCount = 0;  // keeps track of the constructor parameter number being checked

    // We don't know "top down" whether type is a specialization constant,
    // but a const becomes a specialization constant if any of its children are.
    bool hasSpecConst = false;
    bool isConstConstructor = true;

    // for each parameter to the constructor call, check to see if the right type is passed or convert them
    // to the right type if possible (and allowed).
    // for structure constructors, just check if the right type is passed, no conversion is allowed.
    for (TIntermSequence::iterator p = sequenceVector.begin();
                                   p != sequenceVector.end(); p++, paramCount++) {
        if (type.isArray())
            newNode = constructAggregate(*p, elementType, paramCount+1, node->getLoc());
        else if (op == EOpConstructStruct)
            newNode = constructAggregate(*p, *(memberTypes[paramCount]).type, paramCount+1, node->getLoc());
        else
            newNode = constructBuiltIn(type, op, (*p)->getAsTyped(), node->getLoc(), true);

        if (newNode) {
            *p = newNode;
            if (!newNode->getType().getQualifier().isConstant())
                isConstConstructor = false;
            if (newNode->getType().getQualifier().isSpecConstant())
                hasSpecConst = true;
        } else
            return nullptr;
    }

    TIntermTyped* ret_node = intermediate.setAggregateOperator(aggrNode, op, type, loc);

    const char *specConstantCompositeExt[] = { E_GL_EXT_spec_constant_composites };
    if (checkExtensionsRequested(loc, 1, specConstantCompositeExt, "spec constant aggregate constructor")) {
        if (isConstConstructor && hasSpecConst) {
            ret_node->getWritableType().getQualifier().makeSpecConstant();
        }
    }

    TIntermAggregate *agg_node = ret_node->getAsAggregate();
    if (agg_node && (agg_node->isVector() || agg_node->isArray() || agg_node->isMatrix()))
        agg_node->updatePrecision();

    return ret_node;
}